

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O3

void __thiscall ncnn::GRU::GRU(GRU *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__GRU_005a08c8;
  (this->bias_c_data).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->weight_hc_data).data = (void *)0x0;
  (this->weight_hc_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_hc_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_hc_data).elemsize + 4) = 0;
  (this->weight_hc_data).allocator = (Allocator *)0x0;
  (this->weight_hc_data).dims = 0;
  (this->weight_hc_data).w = 0;
  (this->weight_hc_data).w = 0;
  (this->weight_hc_data).h = 0;
  (this->weight_hc_data).d = 0;
  (this->weight_hc_data).c = 0;
  (this->weight_hc_data).cstep = 0;
  (this->weight_xc_data).data = (void *)0x0;
  (this->weight_xc_data).refcount = (int *)0x0;
  (this->weight_xc_data).elemsize = 0;
  (this->weight_xc_data).elempack = 0;
  (this->weight_xc_data).allocator = (Allocator *)0x0;
  (this->weight_xc_data).dims = 0;
  (this->weight_xc_data).w = 0;
  (this->weight_xc_data).w = 0;
  (this->weight_xc_data).h = 0;
  (this->weight_xc_data).d = 0;
  (this->weight_xc_data).c = 0;
  (this->weight_xc_data).cstep = 0;
  (this->bias_c_data).data = (void *)0x0;
  (this->bias_c_data).refcount = (int *)0x0;
  (this->bias_c_data).elemsize = 0;
  (this->bias_c_data).elempack = 0;
  (this->bias_c_data).allocator = (Allocator *)0x0;
  (this->bias_c_data).dims = 0;
  (this->bias_c_data).w = 0;
  (this->bias_c_data).w = 0;
  (this->bias_c_data).h = 0;
  (this->bias_c_data).d = 0;
  (this->bias_c_data).c = 0;
  return;
}

Assistant:

GRU::GRU()
{
    one_blob_only = false;
    support_inplace = false;
}